

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O2

path * mp::path::temp_directory_path(void)

{
  char *pcVar1;
  char *__s;
  string *in_RDI;
  allocator<char> local_31;
  string local_30 [32];
  
  pcVar1 = getenv("TMPDIR");
  __s = "/tmp";
  if (pcVar1 != (char *)0x0) {
    __s = pcVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>(local_30,__s,&local_31);
  std::__cxx11::string::string(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  return (path *)in_RDI;
}

Assistant:

path path::temp_directory_path() {
  const char *dir = std::getenv("TMPDIR");
  if (!dir) {
# ifdef P_tmpdir
    dir = P_tmpdir;
# else
    dir = "/tmp";
# endif
  }
  return path(dir);
}